

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O3

void __thiscall
QWidgetPrivate::invalidateBackingStore_resizeHelper
          (QWidgetPrivate *this,QPoint *oldPos,QSize *oldSize)

{
  QRect *pQVar1;
  int iVar2;
  int iVar3;
  QRect *withinClipRect;
  long lVar4;
  QGraphicsEffect *this_00;
  QWidgetPrivate *this_01;
  QPoint QVar5;
  QWExtra *pQVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  QRect QVar10;
  QRect QVar11;
  QPoint QVar12;
  bool bVar13;
  char cVar14;
  int iVar15;
  int iVar16;
  QWidget *pQVar17;
  int iVar18;
  QPoint *this_02;
  int iVar19;
  int iVar20;
  ulong uVar21;
  long in_FS_OFFSET;
  Representation RVar22;
  Representation RVar23;
  QRect QVar24;
  QRegion staticChildren;
  QRegion parentExpose;
  QRegion dirty;
  undefined1 local_a8 [8];
  QPoint local_a0;
  QRect local_98;
  QRect local_88;
  QPoint local_78;
  double dStack_70;
  double local_68;
  double local_60;
  QRect local_58 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  withinClipRect = *(QRect **)&this->field_0x8;
  lVar4 = *(long *)(withinClipRect + 2);
  iVar16 = (this->data).crect.x1.m_i;
  iVar15 = ((this->data).crect.x2.m_i - iVar16) + 1;
  iVar20 = (oldSize->wd).m_i;
  if (iVar15 < iVar20) {
    iVar19 = (this->data).crect.y1.m_i;
    iVar18 = (oldSize->ht).m_i;
    bVar13 = true;
  }
  else {
    iVar19 = (this->data).crect.y1.m_i;
    iVar18 = (oldSize->ht).m_i;
    bVar13 = ((this->data).crect.y2.m_i - iVar19) + 1 < iVar18;
  }
  iVar2 = (oldPos->xp).m_i;
  iVar3 = (oldPos->yp).m_i;
  bVar8 = iVar19 != iVar3;
  bVar9 = iVar16 != iVar2;
  local_88.x2.m_i = *(int *)(lVar4 + 0x1c) - *(int *)(lVar4 + 0x14);
  pQVar1 = &(this->data).crect;
  bVar7 = (bool)(bVar13 | (bVar8 || bVar9));
  local_88.y2.m_i = *(int *)(lVar4 + 0x20) - *(int *)(lVar4 + 0x18);
  local_88.x1.m_i = 0;
  local_88.y1.m_i = 0;
  local_98.x2.m_i = iVar20 + -1;
  local_98.x1.m_i = 0;
  local_98.y1.m_i = 0;
  local_98.y2.m_i = iVar18 + -1;
  if (((*(uint *)(lVar4 + 8) & 0x20) == 0) || (this->graphicsEffect != (QGraphicsEffect *)0x0)) {
    local_a0 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
    QRegion::QRegion((QRegion *)&local_a0);
    if (!bVar8 && !bVar9) {
      pQVar17 = QWidget::window(*(QWidget **)&this->field_0x8);
      lVar4 = *(long *)(*(long *)&pQVar17->field_0x8 + 0x78);
      if (((lVar4 != 0) && (lVar4 = *(long *)(lVar4 + 8), lVar4 != 0)) &&
         (pQVar17 = *(QWidget **)(lVar4 + 8), pQVar17 != (QWidget *)0x0)) {
        QWidgetRepaintManager::staticContents
                  ((QWidgetRepaintManager *)local_58,pQVar17,withinClipRect);
        QVar5 = local_a0;
        local_a0.xp.m_i = local_58[0].x1.m_i;
        local_a0.yp.m_i = local_58[0].y1.m_i;
        QVar12 = local_a0;
        local_a0.xp = QVar5.xp.m_i;
        local_a0.yp = QVar5.yp.m_i;
        local_58[0].x1.m_i = local_a0.xp.m_i;
        local_58[0].y1.m_i = local_a0.yp.m_i;
        local_a0 = QVar12;
        QRegion::~QRegion((QRegion *)local_58);
      }
    }
    cVar14 = QRegion::isEmpty();
    if (cVar14 == '\0') {
      local_58[0]._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QRegion::QRegion((QRegion *)local_58,&local_88,Rectangle);
      QRegion::operator-=((QRegion *)local_58,(QRegion *)&local_a0);
      invalidateBackingStore<QRegion>(this,(QRegion *)local_58);
      QRegion::~QRegion((QRegion *)local_58);
    }
    else {
      invalidateBackingStore<QRect>(this,&local_88);
    }
    QVar11.x2.m_i = local_58[0].x2.m_i;
    QVar11.y2.m_i = local_58[0].y2.m_i;
    QVar11.x1.m_i = local_58[0].x1.m_i;
    QVar11.y1.m_i = local_58[0].y1.m_i;
    if (bVar7) {
      this_00 = this->graphicsEffect;
      if (this_00 == (QGraphicsEffect *)0x0) {
        pQVar6 = (this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>.
                 _M_t.super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                 super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
        if ((pQVar6 == (QWExtra *)0x0) || ((pQVar6->field_0x7c & 0x80) == 0)) {
          if (cVar14 != '\0') goto LAB_0031cb1e;
          local_78 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
          local_58[0]._0_8_ = *oldPos;
          local_58[0].x2.m_i = (*oldSize).wd.m_i + (int)local_58[0]._0_8_ + -1;
          local_58[0].y2.m_i = (*oldSize).ht.m_i + SUB84(local_58[0]._0_8_,4) + -1;
          QRegion::QRegion((QRegion *)&local_78,local_58,Rectangle);
          QRegion::QRegion((QRegion *)local_58,pQVar1,Rectangle);
          QRegion::operator-=((QRegion *)&local_78,(QRegion *)local_58);
          QRegion::~QRegion((QRegion *)local_58);
          invalidateBackingStore<QRegion>
                    (*(QWidgetPrivate **)(*(long *)(*(long *)&withinClipRect->x2 + 0x10) + 8),
                     (QRegion *)&local_78);
        }
        else {
          local_78 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
          QRegion::translated((int)&local_78,(int)pQVar6 + 0x40);
          local_58[0]._0_8_ = *oldPos;
          local_58[0].x2.m_i = (*oldSize).wd.m_i + (int)local_58[0]._0_8_ + -1;
          local_58[0].y2.m_i = (*oldSize).ht.m_i + SUB84(local_58[0]._0_8_,4) + -1;
          QRegion::operator&=((QRegion *)&local_78,local_58);
          if (cVar14 == '\0') {
            QRegion::QRegion((QRegion *)local_58,pQVar1,Rectangle);
            QRegion::operator-=((QRegion *)&local_78,(QRegion *)local_58);
            QRegion::~QRegion((QRegion *)local_58);
          }
          invalidateBackingStore<QRegion>
                    (*(QWidgetPrivate **)(*(long *)(*(long *)&withinClipRect->x2 + 0x10) + 8),
                     (QRegion *)&local_78);
        }
        QRegion::~QRegion((QRegion *)&local_78);
        QVar11.x2.m_i = local_58[0].x2.m_i;
        QVar11.y2.m_i = local_58[0].y2.m_i;
        QVar11.x1.m_i = local_58[0].x1.m_i;
        QVar11.y1.m_i = local_58[0].y1.m_i;
      }
      else {
LAB_0031cb1e:
        this_01 = *(QWidgetPrivate **)(*(long *)(*(long *)&withinClipRect->x2 + 0x10) + 8);
        QVar5 = *oldPos;
        RVar22 = QVar5.xp.m_i;
        RVar23 = QVar5.yp.m_i;
        uVar21 = (ulong)(uint)RVar23.m_i << 0x20 | (ulong)QVar5 & 0xffffffff;
        iVar20 = RVar22.m_i + (oldSize->wd).m_i + -1;
        iVar16 = (oldSize->ht).m_i + RVar23.m_i + -1;
        QVar10.x2.m_i = iVar20;
        QVar10.y2.m_i = iVar16;
        QVar10.x1.m_i = (int)uVar21;
        QVar10.y1.m_i = (int)(uVar21 >> 0x20);
        QVar24.x2.m_i = iVar20;
        QVar24.y2.m_i = iVar16;
        QVar24.x1.m_i = (int)uVar21;
        QVar24.y1.m_i = (int)(uVar21 >> 0x20);
        if ((this_00 != (QGraphicsEffect *)0x0) &&
           (bVar13 = QGraphicsEffect::isEnabled(this_00), QVar24 = QVar10, bVar13)) {
          local_78 = (QPoint)(double)RVar22.m_i;
          dStack_70 = (double)RVar23.m_i;
          local_68 = (double)(((long)iVar20 - (long)RVar22.m_i) + 1);
          local_60 = (double)(((long)iVar16 - (long)RVar23.m_i) + 1);
          (**(code **)(*(long *)this->graphicsEffect + 0x60))(local_58);
          QVar24 = (QRect)QRectF::toAlignedRect();
        }
        local_58[0] = QVar24;
        invalidateBackingStore<QRect>(this_01,local_58);
        QVar11 = local_58[0];
      }
    }
    this_02 = &local_a0;
  }
  else {
    if (bVar8 || bVar9) {
      if (!bVar13) {
        local_58[0].y2.m_i = iVar3 + iVar18 + -1;
        local_58[0].x2.m_i = local_98.x2.m_i + iVar2;
        local_58[0]._0_8_ = *oldPos;
        moveRect(this,local_58,iVar16 - iVar2,iVar19 - iVar3);
        goto LAB_0031cc67;
      }
      if (iVar20 < iVar15) {
        iVar15 = iVar20;
      }
      iVar20 = ((this->data).crect.y2.m_i - iVar19) + 1;
      if (iVar18 < iVar20) {
        iVar20 = iVar18;
      }
      local_58[0].y2.m_i = iVar3 + iVar20 + -1;
      local_58[0].x2.m_i = iVar15 + -1 + iVar2;
      local_58[0]._0_8_ = *oldPos;
      moveRect(this,local_58,iVar16 - iVar2,iVar19 - iVar3);
LAB_0031cc26:
      cVar14 = QRect::contains(&local_98,SUB81(&local_88,0));
      if (cVar14 == '\0') goto LAB_0031cc67;
    }
    else {
      if (bVar13) goto LAB_0031cc26;
LAB_0031cc67:
      local_58[0]._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QRegion::QRegion((QRegion *)local_58,&local_88,Rectangle);
      QRegion::QRegion((QRegion *)&local_78,&local_98,Rectangle);
      QRegion::operator-=((QRegion *)local_58,(QRegion *)&local_78);
      QRegion::~QRegion((QRegion *)&local_78);
      invalidateBackingStore<QRegion>(this,(QRegion *)local_58);
      QRegion::~QRegion((QRegion *)local_58);
      if (!bVar7) goto LAB_0031cf83;
    }
    local_58[0]._0_8_ = *oldPos;
    local_58[0].x2.m_i = (*oldSize).wd.m_i + (int)local_58[0]._0_8_ + -1;
    local_58[0].y2.m_i = (*oldSize).ht.m_i + SUB84(local_58[0]._0_8_,4) + -1;
    pQVar6 = (this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
             super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
             super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
    if ((pQVar6 == (QWExtra *)0x0) || ((pQVar6->field_0x7c & 0x80) == 0)) {
      this_02 = &local_78;
      local_78 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
      QRegion::QRegion((QRegion *)this_02,local_58,Rectangle);
      QRegion::QRegion((QRegion *)&local_a0,pQVar1,Rectangle);
      QRegion::operator-=((QRegion *)this_02,(QRegion *)&local_a0);
      QRegion::~QRegion((QRegion *)&local_a0);
      invalidateBackingStore<QRegion>
                (*(QWidgetPrivate **)(*(long *)(*(long *)&withinClipRect->x2 + 0x10) + 8),
                 (QRegion *)this_02);
      QVar11.x2.m_i = local_58[0].x2.m_i;
      QVar11.y2.m_i = local_58[0].y2.m_i;
      QVar11.x1.m_i = local_58[0].x1.m_i;
      QVar11.y1.m_i = local_58[0].y1.m_i;
    }
    else {
      this_02 = &local_78;
      local_78 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
      QRegion::QRegion((QRegion *)this_02,local_58,Rectangle);
      QRegion::translated((int)&local_a0,
                          (int)(this->extra)._M_t.
                               super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
                               super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                               super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl + 0x40);
      QRegion::operator&=((QRegion *)this_02,(QRegion *)&local_a0);
      QRegion::~QRegion((QRegion *)&local_a0);
      QRegion::translated((int)(QRect *)local_a8,
                          (int)(this->extra)._M_t.
                               super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
                               super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                               super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl + 0x40);
      QRegion::operator&((QRegion *)&local_a0,(QRect *)local_a8);
      QRegion::operator-=((QRegion *)this_02,(QRegion *)&local_a0);
      QRegion::~QRegion((QRegion *)&local_a0);
      QRegion::~QRegion((QRegion *)local_a8);
      invalidateBackingStore<QRegion>
                (*(QWidgetPrivate **)(*(long *)(*(long *)&withinClipRect->x2 + 0x10) + 8),
                 (QRegion *)this_02);
      QVar11.x2.m_i = local_58[0].x2.m_i;
      QVar11.y2.m_i = local_58[0].y2.m_i;
      QVar11.x1.m_i = local_58[0].x1.m_i;
      QVar11.y1.m_i = local_58[0].y1.m_i;
    }
  }
  local_58[0] = QVar11;
  QRegion::~QRegion((QRegion *)this_02);
LAB_0031cf83:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetPrivate::invalidateBackingStore_resizeHelper(const QPoint &oldPos, const QSize &oldSize)
{
    Q_Q(QWidget);
    Q_ASSERT(!q->isWindow());
    Q_ASSERT(q->parentWidget());

    const bool staticContents = q->testAttribute(Qt::WA_StaticContents);
    const bool sizeDecreased = (data.crect.width() < oldSize.width())
                               || (data.crect.height() < oldSize.height());

    const QPoint offset(data.crect.x() - oldPos.x(), data.crect.y() - oldPos.y());
    const bool parentAreaExposed = !offset.isNull() || sizeDecreased;
    const QRect newWidgetRect(q->rect());
    const QRect oldWidgetRect(0, 0, oldSize.width(), oldSize.height());

    if (!staticContents || graphicsEffect) {
        QRegion staticChildren;
        QWidgetRepaintManager *bs = nullptr;
        if (offset.isNull() && (bs = maybeRepaintManager()))
            staticChildren = bs->staticContents(q, oldWidgetRect);
        const bool hasStaticChildren = !staticChildren.isEmpty();

        if (hasStaticChildren) {
            QRegion dirty(newWidgetRect);
            dirty -= staticChildren;
            invalidateBackingStore(dirty);
        } else {
            // Entire widget needs repaint.
            invalidateBackingStore(newWidgetRect);
        }

        if (!parentAreaExposed)
            return;

        // Invalidate newly exposed area of the parent.
        if (!graphicsEffect && extra && extra->hasMask) {
            QRegion parentExpose(extra->mask.translated(oldPos));
            parentExpose &= QRect(oldPos, oldSize);
            if (hasStaticChildren)
                parentExpose -= data.crect; // Offset is unchanged, safe to do this.
            q->parentWidget()->d_func()->invalidateBackingStore(parentExpose);
        } else {
            if (hasStaticChildren && !graphicsEffect) {
                QRegion parentExpose(QRect(oldPos, oldSize));
                parentExpose -= data.crect; // Offset is unchanged, safe to do this.
                q->parentWidget()->d_func()->invalidateBackingStore(parentExpose);
            } else {
                q->parentWidget()->d_func()->invalidateBackingStore(effectiveRectFor(QRect(oldPos, oldSize)));
            }
        }
        return;
    }

    // Move static content to its new position.
    if (!offset.isNull()) {
        if (sizeDecreased) {
            const QSize minSize(qMin(oldSize.width(), data.crect.width()),
                                qMin(oldSize.height(), data.crect.height()));
            moveRect(QRect(oldPos, minSize), offset.x(), offset.y());
        } else {
            moveRect(QRect(oldPos, oldSize), offset.x(), offset.y());
        }
    }

    // Invalidate newly visible area of the widget.
    if (!sizeDecreased || !oldWidgetRect.contains(newWidgetRect)) {
        QRegion newVisible(newWidgetRect);
        newVisible -= oldWidgetRect;
        invalidateBackingStore(newVisible);
    }

    if (!parentAreaExposed)
        return;

    // Invalidate newly exposed area of the parent.
    const QRect oldRect(oldPos, oldSize);
    if (extra && extra->hasMask) {
        QRegion parentExpose(oldRect);
        parentExpose &= extra->mask.translated(oldPos);
        parentExpose -= (extra->mask.translated(data.crect.topLeft()) & data.crect);
        q->parentWidget()->d_func()->invalidateBackingStore(parentExpose);
    } else {
        QRegion parentExpose(oldRect);
        parentExpose -= data.crect;
        q->parentWidget()->d_func()->invalidateBackingStore(parentExpose);
    }
}